

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O1

int MRIStepSetNonlinear(void *arkode_mem)

{
  int iVar1;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem local_10;
  ARKodeMem local_8;
  
  iVar1 = mriStep_AccessStepMem(arkode_mem,"MRIStepSetNonlinear",&local_8,&local_10);
  if (iVar1 == 0) {
    local_10->linear = 0;
    local_10->linear_timedep = 1;
    local_10->dgmax = 0.2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int MRIStepSetNonlinear(void *arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "MRIStepSetNonlinear",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* set parameters */
  step_mem->linear = SUNFALSE;
  step_mem->linear_timedep = SUNTRUE;
  step_mem->dgmax = DGMAX;

  return(ARK_SUCCESS);
}